

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp_test.c
# Opt level: O1

bool_t botpTest(void)

{
  int iVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  octet *poVar7;
  octet *poVar8;
  uint uVar9;
  octet ctr [8];
  char otp [16];
  char q [32];
  char otp3 [16];
  char otp2 [16];
  char otp1 [16];
  char suite [43];
  octet p [32];
  char p_str [72];
  octet state [2048];
  char s_str [136];
  
  builtin_strncpy(suite + 0x20,"T-S064-T1M",0xb);
  builtin_strncpy(suite + 0x10,"T-8:C-QN08-PHBEL",0x10);
  builtin_strncpy(suite,"OCRA-1:HOTP-HBEL",0x10);
  uVar9 = 0;
  sVar4 = botpHOTP_keep();
  sVar5 = botpTOTP_keep();
  sVar6 = botpOCRA_keep();
  sVar4 = utilMax(3,sVar4,sVar5,sVar6);
  if (sVar4 < 0x801) {
    uVar9 = 0;
    poVar7 = beltH();
    memCopy(ctr,poVar7 + 0xc0,8);
    poVar7 = beltH();
    botpHOTPStart(state,8,poVar7 + 0x80,0x20);
    botpHOTPStepS(state,ctr);
    botpHOTPStepG(ctr,state);
    botpHOTPStepR(otp,state);
    iVar1 = strCmp(otp,"21157984");
    if (iVar1 == 0) {
      botpHOTPStepS(state,ctr);
      bVar2 = botpHOTPStepV(otp,state);
      if (bVar2 != 0) {
        uVar9 = 0;
        poVar7 = beltH();
        botpHOTPRand(otp1,8,poVar7 + 0x80,0x20,ctr);
        iVar1 = strCmp(otp1,otp);
        if (iVar1 == 0) {
          uVar9 = 0;
          poVar7 = beltH();
          eVar3 = botpHOTPVerify(otp1,poVar7 + 0x80,0x20,ctr);
          if (eVar3 == 0) {
            botpHOTPStepR(otp2,state);
            iVar1 = strCmp(otp2,"17877985");
            if (iVar1 == 0) {
              botpHOTPStepR(otp3,state);
              iVar1 = strCmp(otp3,"26078636");
              if (iVar1 == 0) {
                botpHOTPStepG(ctr,state);
                uVar9 = 0;
                poVar7 = beltH();
                botpTOTPStart(state,8,poVar7 + 0x80,0x20);
                botpTOTPStepR(otp,0x1708ab2,state);
                iVar1 = strCmp(otp,"97660664");
                if (iVar1 == 0) {
                  bVar2 = botpTOTPStepV(otp,0x1708ab2,state);
                  if (bVar2 != 0) {
                    uVar9 = 0;
                    poVar7 = beltH();
                    botpTOTPRand(otp,8,poVar7 + 0x80,0x20,0x1708ab2);
                    iVar1 = strCmp(otp,"97660664");
                    if (iVar1 == 0) {
                      uVar9 = 0;
                      poVar7 = beltH();
                      eVar3 = botpTOTPVerify(otp,poVar7 + 0x80,0x20,0x1708ab2);
                      if (eVar3 == 0) {
                        uVar9 = 0;
                        poVar7 = beltH();
                        botpTOTPStart(state,8,poVar7 + 0x80,0x20);
                        botpTOTPStepR(otp,0x1708ab3,state);
                        iVar1 = strCmp(otp,"94431522");
                        if (iVar1 == 0) {
                          uVar9 = 0;
                          poVar7 = beltH();
                          botpTOTPStart(state,8,poVar7 + 0x80,0x20);
                          botpTOTPStepR(otp,0x1708ab4,state);
                          iVar1 = strCmp(otp,"55973851");
                          if (iVar1 == 0) {
                            uVar9 = 0;
                            poVar7 = beltH();
                            bVar2 = botpOCRAStart(state,"OCRA-:HOTP-HBELT-6:C-QN08",poVar7,0x20);
                            if (bVar2 == 0) {
                              uVar9 = 0;
                              poVar7 = beltH();
                              bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-3:C-QN08",poVar7,0x20);
                              if (bVar2 == 0) {
                                uVar9 = 0;
                                poVar7 = beltH();
                                bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-6-QN08",poVar7,0x20);
                                if (bVar2 == 0) {
                                  uVar9 = 0;
                                  poVar7 = beltH();
                                  bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-8:C-QA65",poVar7,
                                                        0x20);
                                  if (bVar2 == 0) {
                                    uVar9 = 0;
                                    poVar7 = beltH();
                                    bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-8:C-QN08-",poVar7
                                                          ,0x20);
                                    if (bVar2 == 0) {
                                      uVar9 = 0;
                                      poVar7 = beltH();
                                      bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-8:C-QN08-PSHA",
                                                            poVar7,0x20);
                                      if (bVar2 == 0) {
                                        uVar9 = 0;
                                        poVar7 = beltH();
                                        bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-8:QN08-SA13",
                                                              poVar7,0x20);
                                        if (bVar2 == 0) {
                                          uVar9 = 0;
                                          poVar7 = beltH();
                                          bVar2 = botpOCRAStart(state,"OCRA-1:HOTP-HBELT-8:QN08-T1N"
                                                                ,poVar7,0x20);
                                          if (bVar2 == 0) {
                                            uVar9 = 0;
                                            poVar7 = beltH();
                                            bVar2 = botpOCRAStart(state,
                                                  "OCRA-1:HOTP-HBELT-8:QN08-T61S",poVar7,0x20);
                                            if (bVar2 == 0) {
                                              uVar9 = 0;
                                              poVar7 = beltH();
                                              bVar2 = botpOCRAStart(state,
                                                  "OCRA-1:HOTP-HBELT-8:QN08-T51H",poVar7,0x20);
                                              if (bVar2 == 0) {
                                                uVar9 = 0;
                                                poVar7 = beltH();
                                                bVar2 = botpOCRAStart(state,
                                                  "OCRA-1:HOTP-HBELT-9:QN08-T8S",poVar7,0x20);
                                                if (bVar2 != 0) {
                                                  uVar9 = 0;
                                                  poVar7 = beltH();
                                                  beltHash(p,poVar7,0xd);
                                                  hexFrom(p_str,p,0x20);
                                                  poVar7 = beltH();
                                                  hexFrom(s_str,poVar7,0x40);
                                                  poVar7 = beltH();
                                                  bVar2 = botpOCRAStart(state,suite,poVar7 + 0x80,
                                                                        0x20);
                                                  if (bVar2 != 0) {
                                                    uVar9 = 0;
                                                    poVar7 = beltH();
                                                    botpOCRAStepS(state,ctr,p,poVar7);
                                                    botpOCRAStepG(ctr,state);
                                                    strCopy(q,otp1);
                                                    sVar4 = strLen(q);
                                                    botpOCRAStepR(otp,(octet *)q,sVar4,0x1708ab7,
                                                                  state);
                                                    iVar1 = strCmp(otp,"85199085");
                                                    if (iVar1 == 0) {
                                                      uVar9 = 0;
                                                      poVar7 = beltH();
                                                      botpOCRAStepS(state,ctr,p,poVar7);
                                                      sVar4 = strLen(q);
                                                      bVar2 = botpOCRAStepV(otp,(octet *)q,sVar4,
                                                                            0x1708ab7,state);
                                                      if (bVar2 != 0) {
                                                        uVar9 = 0;
                                                        poVar7 = beltH();
                                                        sVar4 = strLen(q);
                                                        poVar8 = beltH();
                                                        botpOCRARand(otp,suite,poVar7 + 0x80,0x20,
                                                                     (octet *)q,sVar4,ctr,p,poVar8,
                                                                     0x1708ab7);
                                                        iVar1 = strCmp(otp,"85199085");
                                                        if (iVar1 == 0) {
                                                          uVar9 = 0;
                                                          poVar7 = beltH();
                                                          sVar4 = strLen(q);
                                                          poVar8 = beltH();
                                                          eVar3 = botpOCRAVerify(otp,suite,
                                                                                 poVar7 + 0x80,0x20,
                                                                                 (octet *)q,sVar4,
                                                                                 ctr,p,poVar8,
                                                                                 0x1708ab7);
                                                          if (eVar3 == 0) {
                                                            strCopy(q,otp2);
                                                            sVar4 = strLen(q);
                                                            strCopy(q + sVar4,otp3);
                                                            sVar4 = strLen(q);
                                                            botpOCRAStepR(otp,(octet *)q,sVar4,
                                                                          0x1708ac1,state);
                                                            iVar1 = strCmp(otp,"89873725");
                                                            if (iVar1 == 0) {
                                                              strCopy(q,otp3);
                                                              sVar4 = strLen(q);
                                                              strCopy(q + sVar4,otp2);
                                                              sVar4 = strLen(q);
                                                              botpOCRAStepR(otp,(octet *)q,sVar4,
                                                                            0x1708ac2,state);
                                                              iVar1 = strCmp(otp,"21318915");
                                                              uVar9 = (uint)(iVar1 == 0);
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar9;
}

Assistant:

bool_t botpTest()
{
	octet ctr[8];
	char otp[16], otp1[16], otp2[16], otp3[16];
	const char suite[] = "OCRA-1:HOTP-HBELT-8:C-QN08-PHBELT-S064-T1M";
	char q[32];
	octet p[32];
	char p_str[72];
	char s_str[136];
	tm_time_t t;
	octet state[2048];
	// подготовить память
	if (sizeof(state) < utilMax(3,
		botpHOTP_keep(),
		botpTOTP_keep(),
		botpOCRA_keep()))
		return FALSE;
	// HOTP.1
	memCopy(ctr, beltH() + 192, 8); 
	botpHOTPStart(state, 8, beltH() + 128, 32);
	botpHOTPStepS(state, ctr);
	botpHOTPStepG(ctr, state);
	botpHOTPStepR(otp, state);
	if (!strEq(otp, "21157984"))
		return FALSE;
	botpHOTPStepS(state, ctr);
	if (!botpHOTPStepV(otp, state))
		return FALSE;
	botpHOTPRand(otp1, 8, beltH() + 128, 32, ctr);
	if (!strEq(otp1, otp) ||
		botpHOTPVerify(otp1, beltH() + 128, 32, ctr) != ERR_OK)
		return FALSE;
	// HOTP.2
	botpHOTPStepR(otp2, state);
	if (!strEq(otp2, "17877985"))
		return FALSE;
	// HOTP.3
	botpHOTPStepR(otp3, state);
	if (!strEq(otp3, "26078636"))
		return FALSE;
	botpHOTPStepG(ctr, state);
	// TOTP.1
	t = 1449165288;
	ASSERT(t != TIME_ERR);
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "97660664"))
		return FALSE;
	if (!botpTOTPStepV(otp, t / 60, state))
		return FALSE;
	botpTOTPRand(otp, 8, beltH() + 128, 32, t / 60);
	if (!strEq(otp, "97660664") ||
		botpTOTPVerify(otp, beltH() + 128, 32, t / 60) != ERR_OK)
		return FALSE;
	// TOTP.2
	t /= 60, ++t, t *= 60;
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "94431522"))
		return FALSE;
	// TOTP.3
	t /= 60, t += 2, t *= 60, --t;
	botpTOTPStart(state, 8, beltH() + 128, 32);
	botpTOTPStepR(otp, t / 60, state);
	if (!strEq(otp, "55973851"))
		return FALSE;
	// OCRA.format
	if (botpOCRAStart(state, "OCRA-:HOTP-HBELT-6:C-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-3:C-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-6-QN08", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QA65", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QN08-", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:C-QN08-PSHA", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-SA13", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T1N", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T61S", beltH(), 32) ||
		botpOCRAStart(state, "OCRA-1:HOTP-HBELT-8:QN08-T51H", beltH(), 32) ||
		!botpOCRAStart(state, "OCRA-1:HOTP-HBELT-9:QN08-T8S", beltH(), 32))
		return FALSE;
	// OCRA.1
	beltHash(p, beltH(), 13);
	hexFrom(p_str, p, 32);
	hexFrom(s_str, beltH(), 64); 
	if (!botpOCRAStart(state, suite, beltH() + 128, 32))
		return FALSE;
	botpOCRAStepS(state, ctr, p, beltH());
	botpOCRAStepG(ctr, state);
	t /= 60;
	strCopy(q, otp1);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), t += 3, state);
	if (!strEq(otp, "85199085"))
		return FALSE;
	botpOCRAStepS(state, ctr, p, beltH());
	if (!botpOCRAStepV(otp, (const octet*)q, strLen(q), t, state))
		return FALSE;
	botpOCRARand(otp, suite, beltH() + 128, 32, (const octet*)q, strLen(q), 
		ctr, p, beltH(), t);
	if (!strEq(otp, "85199085"))
		return FALSE;
	if (botpOCRAVerify(otp, suite, beltH() + 128, 32, (const octet*)q, strLen(q), 
		ctr, p, beltH(), t) != ERR_OK)
		return FALSE;
	// OCRA.2
	strCopy(q, otp2);
	strCopy(q + strLen(q), otp3);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), t += 10, state);
	if (!strEq(otp, "89873725"))
		return FALSE;
	// OCRA.3
	strCopy(q, otp3);
	strCopy(q + strLen(q), otp2);
	botpOCRAStepR(otp, (const octet*)q, strLen(q), ++t, state);
	if (!strEq(otp, "21318915"))
		return FALSE;
	// все нормально
	return TRUE;
}